

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppPrinter.cpp
# Opt level: O3

string * __thiscall
hdc::CppPrinter::print_abi_cxx11_(string *__return_storage_ptr__,CppPrinter *this)

{
  char *local_38;
  long local_30;
  char local_28 [16];
  
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_38,local_30);
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  std::__cxx11::stringbuf::str();
  return __return_storage_ptr__;
}

Assistant:

std::string CppPrinter::print() {
    std::cout << output.str();
    return output.str();
}